

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O1

void Sim_UtilAssignRandom(Sim_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  
  pVVar5 = p->pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      if (0 < p->nSimWords) {
        pvVar1 = p->vSim0->pArray[*(int *)((long)pVVar5->pArray[lVar7] + 0x10)];
        lVar6 = 0;
        do {
          iVar2 = rand();
          iVar3 = rand();
          uVar4 = rand();
          *(uint *)((long)pvVar1 + lVar6 * 4) = uVar4 ^ iVar3 << 0xc ^ iVar2 << 0x18;
          lVar6 = lVar6 + 1;
        } while (lVar6 < p->nSimWords);
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->pNtk->vCis;
    } while (lVar7 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Sim_UtilAssignRandom( Sim_Man_t * p )
{
    Abc_Obj_t * pNode;
    unsigned * pSimInfo;
    int i, k;
    // assign the random/systematic simulation info to the PIs
    Abc_NtkForEachCi( p->pNtk, pNode, i )
    {
        pSimInfo = (unsigned *)p->vSim0->pArray[pNode->Id];
        for ( k = 0; k < p->nSimWords; k++ )
            pSimInfo[k] = SIM_RANDOM_UNSIGNED;
    }
}